

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::setNum(QByteArray *this,double n,char format,int precision)

{
  long lVar1;
  QByteArray *pQVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  QByteArray *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  number((double)in_RDI,(char)((ulong)in_XMM0_Qa >> 0x38),(int)in_XMM0_Qa);
  pQVar2 = operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~QByteArray((QByteArray *)0x4b9372);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::setNum(double n, char format, int precision)
{
    return *this = QByteArray::number(n, format, precision);
}